

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O2

void Rtm_ObjMarkAutoBwd_rec(Rtm_Obj_t *pObj)

{
  uint uVar1;
  Rtm_Obj_t *pRVar2;
  ulong uVar3;
  
  if ((*(uint *)&pObj->field_0x8 & 0x10) == 0) {
    uVar1 = *(uint *)&pObj->field_0x8 | 0x10;
    *(uint *)&pObj->field_0x8 = uVar1;
    pRVar2 = pObj + 1;
    for (uVar3 = 0; uVar3 < (uVar1 >> 7 & 0xff); uVar3 = uVar3 + 1) {
      Rtm_ObjMarkAutoBwd_rec((Rtm_Obj_t *)pRVar2->pCopy);
      uVar1 = *(uint *)&pObj->field_0x8;
      pRVar2 = (Rtm_Obj_t *)&pRVar2->Temp;
    }
  }
  return;
}

Assistant:

void Rtm_ObjMarkAutoBwd_rec( Rtm_Obj_t * pObj )
{
    Rtm_Obj_t * pFanin;
    int i;
    if ( pObj->fAuto )
        return;
    pObj->fAuto = 1;
    Rtm_ObjForEachFanin( pObj, pFanin, i )
        Rtm_ObjMarkAutoBwd_rec( pFanin );
}